

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

CallInfo * luaE_extendCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *pCVar2;
  
  pCVar2 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x48);
  pCVar1 = L->ci;
  pCVar1->next = pCVar2;
  pCVar2->previous = pCVar1;
  pCVar2->next = (CallInfo *)0x0;
  L->nci = L->nci + 1;
  return pCVar2;
}

Assistant:

CallInfo *luaE_extendCI(lua_State *L) {
    CallInfo *ci = luaM_new(L, CallInfo);
    lua_assert(L->ci->next == NULL);
    L->ci->next = ci;
    ci->previous = L->ci;
    ci->next = NULL;
    L->nci++;
    return ci;
}